

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

bool __thiscall CLIntercept::initDispatch(CLIntercept *this,string *libName)

{
  void **ppvVar1;
  bool bVar2;
  void *pvVar3;
  long *plVar4;
  cl_api_clGetPlatformIDs p_Var5;
  cl_api_clGetPlatformInfo p_Var6;
  cl_api_clGetDeviceIDs p_Var7;
  cl_api_clGetDeviceInfo p_Var8;
  cl_api_clCreateContext p_Var9;
  cl_api_clCreateContextFromType p_Var10;
  cl_api_clRetainContext p_Var11;
  cl_api_clReleaseContext p_Var12;
  cl_api_clGetContextInfo p_Var13;
  cl_api_clCreateCommandQueue p_Var14;
  cl_api_clRetainCommandQueue p_Var15;
  cl_api_clReleaseCommandQueue p_Var16;
  cl_api_clGetCommandQueueInfo p_Var17;
  cl_api_clSetCommandQueueProperty p_Var18;
  cl_api_clCreateBuffer p_Var19;
  cl_api_clCreateImage2D p_Var20;
  cl_api_clCreateImage3D p_Var21;
  cl_api_clRetainMemObject p_Var22;
  cl_api_clReleaseMemObject p_Var23;
  cl_api_clGetSupportedImageFormats p_Var24;
  cl_api_clGetMemObjectInfo p_Var25;
  cl_api_clGetImageInfo p_Var26;
  cl_api_clCreateSampler p_Var27;
  cl_api_clRetainSampler p_Var28;
  cl_api_clReleaseSampler p_Var29;
  cl_api_clGetSamplerInfo p_Var30;
  cl_api_clCreateProgramWithSource p_Var31;
  cl_api_clCreateProgramWithBinary p_Var32;
  cl_api_clRetainProgram p_Var33;
  cl_api_clReleaseProgram p_Var34;
  cl_api_clBuildProgram p_Var35;
  cl_api_clUnloadCompiler p_Var36;
  cl_api_clGetProgramInfo p_Var37;
  cl_api_clGetProgramBuildInfo p_Var38;
  cl_api_clCreateKernel p_Var39;
  cl_api_clCreateKernelsInProgram p_Var40;
  cl_api_clRetainKernel p_Var41;
  cl_api_clReleaseKernel p_Var42;
  cl_api_clSetKernelArg p_Var43;
  cl_api_clGetKernelInfo p_Var44;
  cl_api_clGetKernelWorkGroupInfo p_Var45;
  cl_api_clWaitForEvents p_Var46;
  cl_api_clGetEventInfo p_Var47;
  cl_api_clRetainEvent p_Var48;
  cl_api_clReleaseEvent p_Var49;
  cl_api_clGetEventProfilingInfo p_Var50;
  cl_api_clFlush p_Var51;
  cl_api_clFinish p_Var52;
  cl_api_clEnqueueReadBuffer p_Var53;
  cl_api_clEnqueueWriteBuffer p_Var54;
  cl_api_clEnqueueCopyBuffer p_Var55;
  cl_api_clEnqueueReadImage p_Var56;
  cl_api_clEnqueueWriteImage p_Var57;
  cl_api_clEnqueueCopyImage p_Var58;
  cl_api_clEnqueueCopyImageToBuffer p_Var59;
  cl_api_clEnqueueCopyBufferToImage p_Var60;
  cl_api_clEnqueueMapBuffer p_Var61;
  cl_api_clEnqueueMapImage p_Var62;
  cl_api_clEnqueueUnmapMemObject p_Var63;
  cl_api_clEnqueueNDRangeKernel p_Var64;
  cl_api_clEnqueueTask p_Var65;
  cl_api_clEnqueueNativeKernel p_Var66;
  cl_api_clEnqueueMarker p_Var67;
  cl_api_clEnqueueWaitForEvents p_Var68;
  cl_api_clEnqueueBarrier p_Var69;
  cl_api_clGetExtensionFunctionAddress p_Var70;
  cl_api_clGetGLContextInfoKHR p_Var71;
  cl_api_clCreateFromGLBuffer p_Var72;
  cl_api_clCreateFromGLTexture p_Var73;
  cl_api_clCreateFromGLTexture2D p_Var74;
  cl_api_clCreateFromGLTexture3D p_Var75;
  cl_api_clCreateFromGLRenderbuffer p_Var76;
  cl_api_clGetGLObjectInfo p_Var77;
  cl_api_clGetGLTextureInfo p_Var78;
  cl_api_clEnqueueAcquireGLObjects p_Var79;
  cl_api_clEnqueueReleaseGLObjects p_Var80;
  cl_api_clSetEventCallback p_Var81;
  cl_api_clCreateSubBuffer p_Var82;
  cl_api_clSetMemObjectDestructorCallback p_Var83;
  cl_api_clCreateUserEvent p_Var84;
  cl_api_clSetUserEventStatus p_Var85;
  cl_api_clEnqueueReadBufferRect p_Var86;
  cl_api_clEnqueueWriteBufferRect p_Var87;
  cl_api_clEnqueueCopyBufferRect p_Var88;
  cl_api_clCreateSubDevices p_Var89;
  cl_api_clRetainDevice p_Var90;
  cl_api_clReleaseDevice p_Var91;
  cl_api_clCreateImage p_Var92;
  cl_api_clCreateProgramWithBuiltInKernels p_Var93;
  cl_api_clCompileProgram p_Var94;
  cl_api_clLinkProgram p_Var95;
  cl_api_clUnloadPlatformCompiler p_Var96;
  cl_api_clGetKernelArgInfo p_Var97;
  cl_api_clEnqueueFillBuffer p_Var98;
  cl_api_clEnqueueFillImage p_Var99;
  cl_api_clEnqueueMigrateMemObjects p_Var100;
  cl_api_clEnqueueMarkerWithWaitList p_Var101;
  cl_api_clEnqueueBarrierWithWaitList p_Var102;
  cl_api_clGetExtensionFunctionAddressForPlatform p_Var103;
  cl_api_clCreateCommandQueueWithProperties p_Var104;
  cl_api_clCreatePipe p_Var105;
  cl_api_clGetPipeInfo p_Var106;
  cl_api_clSVMAlloc p_Var107;
  cl_api_clSVMFree p_Var108;
  cl_api_clEnqueueSVMFree p_Var109;
  cl_api_clEnqueueSVMMemcpy p_Var110;
  cl_api_clEnqueueSVMMemFill p_Var111;
  cl_api_clEnqueueSVMMap p_Var112;
  cl_api_clEnqueueSVMUnmap p_Var113;
  cl_api_clCreateSamplerWithProperties p_Var114;
  cl_api_clSetKernelArgSVMPointer p_Var115;
  cl_api_clSetKernelExecInfo p_Var116;
  cl_api_clCloneKernel p_Var117;
  cl_api_clCreateProgramWithIL p_Var118;
  cl_api_clEnqueueSVMMigrateMem p_Var119;
  cl_api_clGetDeviceAndHostTimer p_Var120;
  cl_api_clGetHostTimer p_Var121;
  cl_api_clGetKernelSubGroupInfo p_Var122;
  cl_api_clSetDefaultDeviceCommandQueue p_Var123;
  cl_api_clSetProgramReleaseCallback p_Var124;
  cl_api_clSetProgramSpecializationConstant p_Var125;
  cl_api_clCreateBufferWithProperties p_Var126;
  cl_api_clCreateImageWithProperties p_Var127;
  cl_api_clSetContextDestructorCallback p_Var128;
  undefined8 *puVar129;
  long *plVar130;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Da_27;
  undefined4 extraout_XMM0_Da_28;
  undefined4 extraout_XMM0_Da_29;
  undefined4 extraout_XMM0_Da_30;
  undefined4 extraout_XMM0_Da_31;
  undefined4 extraout_XMM0_Da_32;
  undefined4 extraout_XMM0_Da_33;
  undefined4 extraout_XMM0_Da_34;
  undefined4 extraout_XMM0_Da_35;
  undefined4 extraout_XMM0_Da_36;
  undefined4 extraout_XMM0_Da_37;
  undefined4 extraout_XMM0_Da_38;
  undefined4 extraout_XMM0_Da_39;
  undefined4 extraout_XMM0_Da_40;
  undefined4 extraout_XMM0_Da_41;
  undefined4 extraout_XMM0_Da_42;
  undefined4 extraout_XMM0_Da_43;
  undefined4 extraout_XMM0_Da_44;
  undefined4 extraout_XMM0_Da_45;
  undefined4 extraout_XMM0_Da_46;
  undefined4 extraout_XMM0_Da_47;
  undefined4 extraout_XMM0_Da_48;
  undefined4 extraout_XMM0_Da_49;
  undefined4 extraout_XMM0_Da_50;
  undefined4 extraout_XMM0_Da_51;
  undefined4 extraout_XMM0_Da_52;
  undefined4 extraout_XMM0_Da_53;
  undefined4 extraout_XMM0_Da_54;
  undefined4 extraout_XMM0_Da_55;
  undefined4 extraout_XMM0_Da_56;
  undefined4 extraout_XMM0_Da_57;
  undefined4 extraout_XMM0_Da_58;
  undefined4 extraout_XMM0_Da_59;
  undefined4 extraout_XMM0_Da_60;
  undefined4 extraout_XMM0_Da_61;
  undefined4 extraout_XMM0_Da_62;
  undefined4 extraout_XMM0_Da_63;
  undefined4 extraout_XMM0_Da_64;
  undefined4 extraout_XMM0_Da_65;
  undefined4 extraout_XMM0_Da_66;
  undefined4 extraout_XMM0_Da_67;
  undefined4 extraout_XMM0_Da_68;
  undefined4 extraout_XMM0_Da_69;
  undefined4 extraout_XMM0_Da_70;
  undefined4 extraout_XMM0_Da_71;
  undefined4 extraout_XMM0_Da_72;
  undefined4 extraout_XMM0_Da_73;
  undefined4 extraout_XMM0_Da_74;
  undefined4 extraout_XMM0_Da_75;
  undefined4 extraout_XMM0_Da_76;
  undefined4 extraout_XMM0_Da_77;
  undefined4 extraout_XMM0_Da_78;
  undefined4 extraout_XMM0_Da_79;
  undefined4 extraout_XMM0_Da_80;
  undefined4 extraout_XMM0_Da_81;
  undefined4 extraout_XMM0_Da_82;
  undefined4 extraout_XMM0_Da_83;
  undefined4 extraout_XMM0_Da_84;
  undefined4 extraout_XMM0_Da_85;
  undefined4 extraout_XMM0_Da_86;
  undefined4 extraout_XMM0_Da_87;
  undefined4 extraout_XMM0_Da_88;
  undefined4 extraout_XMM0_Da_89;
  undefined4 extraout_XMM0_Da_90;
  undefined4 extraout_XMM0_Da_91;
  undefined4 extraout_XMM0_Da_92;
  undefined4 extraout_XMM0_Da_93;
  undefined4 extraout_XMM0_Da_94;
  undefined4 extraout_XMM0_Da_95;
  undefined4 extraout_XMM0_Da_96;
  undefined4 extraout_XMM0_Da_97;
  undefined4 extraout_XMM0_Da_98;
  undefined4 extraout_XMM0_Da_99;
  undefined4 extraout_XMM0_Da_x00100;
  undefined4 extraout_XMM0_Da_x00101;
  undefined4 extraout_XMM0_Da_x00102;
  undefined4 extraout_XMM0_Da_x00103;
  undefined4 extraout_XMM0_Da_x00104;
  undefined4 extraout_XMM0_Da_x00105;
  undefined4 extraout_XMM0_Da_x00106;
  undefined4 extraout_XMM0_Da_x00107;
  undefined4 extraout_XMM0_Da_x00108;
  undefined4 extraout_XMM0_Da_x00109;
  undefined4 extraout_XMM0_Da_x00110;
  undefined4 extraout_XMM0_Da_x00111;
  undefined4 extraout_XMM0_Da_x00112;
  undefined4 extraout_XMM0_Da_x00113;
  undefined4 extraout_XMM0_Da_x00114;
  undefined4 extraout_XMM0_Da_x00115;
  undefined4 extraout_XMM0_Da_x00116;
  undefined4 extraout_XMM0_Da_x00117;
  undefined4 extraout_XMM0_Da_x00118;
  undefined4 extraout_XMM0_Da_x00119;
  undefined4 extraout_XMM0_Da_x00120;
  undefined4 extraout_XMM0_Da_x00121;
  undefined4 extraout_XMM0_Da_x00122;
  undefined4 extraout_XMM0_Da_x00123;
  undefined4 uVar131;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  undefined4 extraout_XMM0_Db_27;
  undefined4 extraout_XMM0_Db_28;
  undefined4 extraout_XMM0_Db_29;
  undefined4 extraout_XMM0_Db_30;
  undefined4 extraout_XMM0_Db_31;
  undefined4 extraout_XMM0_Db_32;
  undefined4 extraout_XMM0_Db_33;
  undefined4 extraout_XMM0_Db_34;
  undefined4 extraout_XMM0_Db_35;
  undefined4 extraout_XMM0_Db_36;
  undefined4 extraout_XMM0_Db_37;
  undefined4 extraout_XMM0_Db_38;
  undefined4 extraout_XMM0_Db_39;
  undefined4 extraout_XMM0_Db_40;
  undefined4 extraout_XMM0_Db_41;
  undefined4 extraout_XMM0_Db_42;
  undefined4 extraout_XMM0_Db_43;
  undefined4 extraout_XMM0_Db_44;
  undefined4 extraout_XMM0_Db_45;
  undefined4 extraout_XMM0_Db_46;
  undefined4 extraout_XMM0_Db_47;
  undefined4 extraout_XMM0_Db_48;
  undefined4 extraout_XMM0_Db_49;
  undefined4 extraout_XMM0_Db_50;
  undefined4 extraout_XMM0_Db_51;
  undefined4 extraout_XMM0_Db_52;
  undefined4 extraout_XMM0_Db_53;
  undefined4 extraout_XMM0_Db_54;
  undefined4 extraout_XMM0_Db_55;
  undefined4 extraout_XMM0_Db_56;
  undefined4 extraout_XMM0_Db_57;
  undefined4 extraout_XMM0_Db_58;
  undefined4 extraout_XMM0_Db_59;
  undefined4 extraout_XMM0_Db_60;
  undefined4 extraout_XMM0_Db_61;
  undefined4 extraout_XMM0_Db_62;
  undefined4 extraout_XMM0_Db_63;
  undefined4 extraout_XMM0_Db_64;
  undefined4 extraout_XMM0_Db_65;
  undefined4 extraout_XMM0_Db_66;
  undefined4 extraout_XMM0_Db_67;
  undefined4 extraout_XMM0_Db_68;
  undefined4 extraout_XMM0_Db_69;
  undefined4 extraout_XMM0_Db_70;
  undefined4 extraout_XMM0_Db_71;
  undefined4 extraout_XMM0_Db_72;
  undefined4 extraout_XMM0_Db_73;
  undefined4 extraout_XMM0_Db_74;
  undefined4 extraout_XMM0_Db_75;
  undefined4 extraout_XMM0_Db_76;
  undefined4 extraout_XMM0_Db_77;
  undefined4 extraout_XMM0_Db_78;
  undefined4 extraout_XMM0_Db_79;
  undefined4 extraout_XMM0_Db_80;
  undefined4 extraout_XMM0_Db_81;
  undefined4 extraout_XMM0_Db_82;
  undefined4 extraout_XMM0_Db_83;
  undefined4 extraout_XMM0_Db_84;
  undefined4 extraout_XMM0_Db_85;
  undefined4 extraout_XMM0_Db_86;
  undefined4 extraout_XMM0_Db_87;
  undefined4 extraout_XMM0_Db_88;
  undefined4 extraout_XMM0_Db_89;
  undefined4 extraout_XMM0_Db_90;
  undefined4 extraout_XMM0_Db_91;
  undefined4 extraout_XMM0_Db_92;
  undefined4 extraout_XMM0_Db_93;
  undefined4 extraout_XMM0_Db_94;
  undefined4 extraout_XMM0_Db_95;
  undefined4 extraout_XMM0_Db_96;
  undefined4 extraout_XMM0_Db_97;
  undefined4 extraout_XMM0_Db_98;
  undefined4 extraout_XMM0_Db_99;
  undefined4 extraout_XMM0_Db_x00100;
  undefined4 extraout_XMM0_Db_x00101;
  undefined4 extraout_XMM0_Db_x00102;
  undefined4 extraout_XMM0_Db_x00103;
  undefined4 extraout_XMM0_Db_x00104;
  undefined4 extraout_XMM0_Db_x00105;
  undefined4 extraout_XMM0_Db_x00106;
  undefined4 extraout_XMM0_Db_x00107;
  undefined4 extraout_XMM0_Db_x00108;
  undefined4 extraout_XMM0_Db_x00109;
  undefined4 extraout_XMM0_Db_x00110;
  undefined4 extraout_XMM0_Db_x00111;
  undefined4 extraout_XMM0_Db_x00112;
  undefined4 extraout_XMM0_Db_x00113;
  undefined4 extraout_XMM0_Db_x00114;
  undefined4 extraout_XMM0_Db_x00115;
  undefined4 extraout_XMM0_Db_x00116;
  undefined4 extraout_XMM0_Db_x00117;
  undefined4 extraout_XMM0_Db_x00118;
  undefined4 extraout_XMM0_Db_x00119;
  undefined4 extraout_XMM0_Db_x00120;
  undefined4 extraout_XMM0_Db_x00121;
  undefined4 extraout_XMM0_Db_x00122;
  undefined4 extraout_XMM0_Db_x00123;
  undefined4 uVar132;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__cxx11::string::string
            ((string *)&local_90,(libName->_M_dataplus)._M_p,(allocator *)&local_70);
  pvVar3 = (void *)dlopen(local_90,0x102);
  ppvVar1 = &this->m_OpenCLLibraryHandle;
  this->m_OpenCLLibraryHandle = pvVar3;
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  bVar2 = true;
  if (*ppvVar1 == (void *)0x0) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Couldn\'t load library: ","");
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_50,(ulong)(libName->_M_dataplus)._M_p);
    plVar130 = plVar4 + 2;
    if ((long *)*plVar4 == plVar130) {
      local_60 = *plVar130;
      lStack_58 = plVar4[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar130;
      local_70 = (long *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)plVar130;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    plVar130 = plVar4 + 2;
    if ((long *)*plVar4 == plVar130) {
      uVar131 = (undefined4)*plVar130;
      uVar132 = *(undefined4 *)((long)plVar4 + 0x14);
      local_80 = *plVar130;
      uStack_78 = (undefined4)plVar4[3];
      uStack_74 = *(undefined4 *)((long)plVar4 + 0x1c);
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar130;
      uVar131 = extraout_XMM0_Da;
      uVar132 = extraout_XMM0_Db;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar130;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    log(this,(double)CONCAT44(uVar132,uVar131));
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    bVar2 = false;
  }
  if (bVar2) {
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetPlatformIDs","");
    p_Var5 = (cl_api_clGetPlatformIDs)
             dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var5 == (cl_api_clGetPlatformIDs)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_00;
        uVar132 = extraout_XMM0_Db_00;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetPlatformIDs = p_Var5;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetPlatformInfo","");
    p_Var6 = (cl_api_clGetPlatformInfo)
             dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var6 == (cl_api_clGetPlatformInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_01;
        uVar132 = extraout_XMM0_Db_01;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetPlatformInfo = p_Var6;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetDeviceIDs","");
    p_Var7 = (cl_api_clGetDeviceIDs)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var7 == (cl_api_clGetDeviceIDs)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_02;
        uVar132 = extraout_XMM0_Db_02;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetDeviceIDs = p_Var7;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetDeviceInfo","");
    p_Var8 = (cl_api_clGetDeviceInfo)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90)
    ;
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var8 == (cl_api_clGetDeviceInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_03;
        uVar132 = extraout_XMM0_Db_03;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetDeviceInfo = p_Var8;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateContext","");
    p_Var9 = (cl_api_clCreateContext)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90)
    ;
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var9 == (cl_api_clCreateContext)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_04;
        uVar132 = extraout_XMM0_Db_04;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clCreateContext = p_Var9;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clCreateContextFromType","");
    p_Var10 = (cl_api_clCreateContextFromType)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var10 == (cl_api_clCreateContextFromType)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_05;
        uVar132 = extraout_XMM0_Db_05;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clCreateContextFromType = p_Var10;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clRetainContext","");
    p_Var11 = (cl_api_clRetainContext)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var11 == (cl_api_clRetainContext)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_06;
        uVar132 = extraout_XMM0_Db_06;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clRetainContext = p_Var11;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clReleaseContext","");
    p_Var12 = (cl_api_clReleaseContext)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var12 == (cl_api_clReleaseContext)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_07;
        uVar132 = extraout_XMM0_Db_07;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clReleaseContext = p_Var12;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetContextInfo","");
    p_Var13 = (cl_api_clGetContextInfo)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var13 == (cl_api_clGetContextInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_08;
        uVar132 = extraout_XMM0_Db_08;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetContextInfo = p_Var13;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateCommandQueue","");
    p_Var14 = (cl_api_clCreateCommandQueue)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var14 == (cl_api_clCreateCommandQueue)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_09;
        uVar132 = extraout_XMM0_Db_09;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clCreateCommandQueue = p_Var14;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clRetainCommandQueue","");
    p_Var15 = (cl_api_clRetainCommandQueue)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var15 == (cl_api_clRetainCommandQueue)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_10;
        uVar132 = extraout_XMM0_Db_10;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clRetainCommandQueue = p_Var15;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clReleaseCommandQueue","");
    p_Var16 = (cl_api_clReleaseCommandQueue)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var16 == (cl_api_clReleaseCommandQueue)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_11;
        uVar132 = extraout_XMM0_Db_11;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clReleaseCommandQueue = p_Var16;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetCommandQueueInfo","");
    p_Var17 = (cl_api_clGetCommandQueueInfo)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var17 == (cl_api_clGetCommandQueueInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_12;
        uVar132 = extraout_XMM0_Db_12;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetCommandQueueInfo = p_Var17;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clSetCommandQueueProperty","");
    p_Var18 = (cl_api_clSetCommandQueueProperty)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var18 == (cl_api_clSetCommandQueueProperty)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_13;
        uVar132 = extraout_XMM0_Db_13;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clSetCommandQueueProperty = p_Var18;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateBuffer","");
    p_Var19 = (cl_api_clCreateBuffer)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90)
    ;
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var19 == (cl_api_clCreateBuffer)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_14;
        uVar132 = extraout_XMM0_Db_14;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clCreateBuffer = p_Var19;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateImage2D","");
    p_Var20 = (cl_api_clCreateImage2D)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var20 == (cl_api_clCreateImage2D)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_15;
        uVar132 = extraout_XMM0_Db_15;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clCreateImage2D = p_Var20;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateImage3D","");
    p_Var21 = (cl_api_clCreateImage3D)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var21 == (cl_api_clCreateImage3D)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_16;
        uVar132 = extraout_XMM0_Db_16;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clCreateImage3D = p_Var21;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clRetainMemObject","");
    p_Var22 = (cl_api_clRetainMemObject)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var22 == (cl_api_clRetainMemObject)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_17;
        uVar132 = extraout_XMM0_Db_17;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clRetainMemObject = p_Var22;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clReleaseMemObject","");
    p_Var23 = (cl_api_clReleaseMemObject)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var23 == (cl_api_clReleaseMemObject)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_18;
        uVar132 = extraout_XMM0_Db_18;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clReleaseMemObject = p_Var23;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clGetSupportedImageFormats","");
    p_Var24 = (cl_api_clGetSupportedImageFormats)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var24 == (cl_api_clGetSupportedImageFormats)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_19;
        uVar132 = extraout_XMM0_Db_19;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetSupportedImageFormats = p_Var24;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetMemObjectInfo","");
    p_Var25 = (cl_api_clGetMemObjectInfo)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var25 == (cl_api_clGetMemObjectInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_20;
        uVar132 = extraout_XMM0_Db_20;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetMemObjectInfo = p_Var25;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetImageInfo","");
    p_Var26 = (cl_api_clGetImageInfo)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90)
    ;
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var26 == (cl_api_clGetImageInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_21;
        uVar132 = extraout_XMM0_Db_21;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetImageInfo = p_Var26;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateSampler","");
    p_Var27 = (cl_api_clCreateSampler)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var27 == (cl_api_clCreateSampler)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_22;
        uVar132 = extraout_XMM0_Db_22;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clCreateSampler = p_Var27;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clRetainSampler","");
    p_Var28 = (cl_api_clRetainSampler)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var28 == (cl_api_clRetainSampler)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_23;
        uVar132 = extraout_XMM0_Db_23;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clRetainSampler = p_Var28;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clReleaseSampler","");
    p_Var29 = (cl_api_clReleaseSampler)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var29 == (cl_api_clReleaseSampler)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_24;
        uVar132 = extraout_XMM0_Db_24;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clReleaseSampler = p_Var29;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetSamplerInfo","");
    p_Var30 = (cl_api_clGetSamplerInfo)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var30 == (cl_api_clGetSamplerInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_25;
        uVar132 = extraout_XMM0_Db_25;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetSamplerInfo = p_Var30;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clCreateProgramWithSource","");
    p_Var31 = (cl_api_clCreateProgramWithSource)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var31 == (cl_api_clCreateProgramWithSource)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_26;
        uVar132 = extraout_XMM0_Db_26;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clCreateProgramWithSource = p_Var31;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clCreateProgramWithBinary","");
    p_Var32 = (cl_api_clCreateProgramWithBinary)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var32 == (cl_api_clCreateProgramWithBinary)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_27;
        uVar132 = extraout_XMM0_Db_27;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clCreateProgramWithBinary = p_Var32;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clRetainProgram","");
    p_Var33 = (cl_api_clRetainProgram)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var33 == (cl_api_clRetainProgram)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_28;
        uVar132 = extraout_XMM0_Db_28;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clRetainProgram = p_Var33;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clReleaseProgram","");
    p_Var34 = (cl_api_clReleaseProgram)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var34 == (cl_api_clReleaseProgram)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_29;
        uVar132 = extraout_XMM0_Db_29;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clReleaseProgram = p_Var34;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clBuildProgram","");
    p_Var35 = (cl_api_clBuildProgram)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90)
    ;
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var35 == (cl_api_clBuildProgram)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_30;
        uVar132 = extraout_XMM0_Db_30;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clBuildProgram = p_Var35;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clUnloadCompiler","");
    p_Var36 = (cl_api_clUnloadCompiler)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var36 == (cl_api_clUnloadCompiler)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_31;
        uVar132 = extraout_XMM0_Db_31;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clUnloadCompiler = p_Var36;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetProgramInfo","");
    p_Var37 = (cl_api_clGetProgramInfo)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var37 == (cl_api_clGetProgramInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_32;
        uVar132 = extraout_XMM0_Db_32;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetProgramInfo = p_Var37;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetProgramBuildInfo","");
    p_Var38 = (cl_api_clGetProgramBuildInfo)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var38 == (cl_api_clGetProgramBuildInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_33;
        uVar132 = extraout_XMM0_Db_33;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetProgramBuildInfo = p_Var38;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateKernel","");
    p_Var39 = (cl_api_clCreateKernel)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90)
    ;
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var39 == (cl_api_clCreateKernel)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_34;
        uVar132 = extraout_XMM0_Db_34;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clCreateKernel = p_Var39;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clCreateKernelsInProgram","");
    p_Var40 = (cl_api_clCreateKernelsInProgram)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var40 == (cl_api_clCreateKernelsInProgram)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_35;
        uVar132 = extraout_XMM0_Db_35;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clCreateKernelsInProgram = p_Var40;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clRetainKernel","");
    p_Var41 = (cl_api_clRetainKernel)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90)
    ;
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var41 == (cl_api_clRetainKernel)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_36;
        uVar132 = extraout_XMM0_Db_36;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clRetainKernel = p_Var41;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clReleaseKernel","");
    p_Var42 = (cl_api_clReleaseKernel)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var42 == (cl_api_clReleaseKernel)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_37;
        uVar132 = extraout_XMM0_Db_37;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clReleaseKernel = p_Var42;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clSetKernelArg","");
    p_Var43 = (cl_api_clSetKernelArg)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90)
    ;
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var43 == (cl_api_clSetKernelArg)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_38;
        uVar132 = extraout_XMM0_Db_38;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clSetKernelArg = p_Var43;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetKernelInfo","");
    p_Var44 = (cl_api_clGetKernelInfo)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var44 == (cl_api_clGetKernelInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_39;
        uVar132 = extraout_XMM0_Db_39;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetKernelInfo = p_Var44;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clGetKernelWorkGroupInfo","");
    p_Var45 = (cl_api_clGetKernelWorkGroupInfo)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var45 == (cl_api_clGetKernelWorkGroupInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_40;
        uVar132 = extraout_XMM0_Db_40;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetKernelWorkGroupInfo = p_Var45;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clWaitForEvents","");
    p_Var46 = (cl_api_clWaitForEvents)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var46 == (cl_api_clWaitForEvents)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_41;
        uVar132 = extraout_XMM0_Db_41;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clWaitForEvents = p_Var46;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetEventInfo","");
    p_Var47 = (cl_api_clGetEventInfo)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90)
    ;
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var47 == (cl_api_clGetEventInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_42;
        uVar132 = extraout_XMM0_Db_42;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetEventInfo = p_Var47;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clRetainEvent","");
    p_Var48 = (cl_api_clRetainEvent)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var48 == (cl_api_clRetainEvent)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_43;
        uVar132 = extraout_XMM0_Db_43;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clRetainEvent = p_Var48;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clReleaseEvent","");
    p_Var49 = (cl_api_clReleaseEvent)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90)
    ;
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var49 == (cl_api_clReleaseEvent)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_44;
        uVar132 = extraout_XMM0_Db_44;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clReleaseEvent = p_Var49;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clGetEventProfilingInfo","");
    p_Var50 = (cl_api_clGetEventProfilingInfo)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var50 == (cl_api_clGetEventProfilingInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_45;
        uVar132 = extraout_XMM0_Db_45;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clGetEventProfilingInfo = p_Var50;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clFlush","");
    p_Var51 = (cl_api_clFlush)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var51 == (cl_api_clFlush)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_46;
        uVar132 = extraout_XMM0_Db_46;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clFlush = p_Var51;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clFinish","");
    p_Var52 = (cl_api_clFinish)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var52 == (cl_api_clFinish)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_47;
        uVar132 = extraout_XMM0_Db_47;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clFinish = p_Var52;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueReadBuffer","");
    p_Var53 = (cl_api_clEnqueueReadBuffer)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var53 == (cl_api_clEnqueueReadBuffer)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_48;
        uVar132 = extraout_XMM0_Db_48;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueReadBuffer = p_Var53;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueWriteBuffer","");
    p_Var54 = (cl_api_clEnqueueWriteBuffer)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var54 == (cl_api_clEnqueueWriteBuffer)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_49;
        uVar132 = extraout_XMM0_Db_49;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueWriteBuffer = p_Var54;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueCopyBuffer","");
    p_Var55 = (cl_api_clEnqueueCopyBuffer)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var55 == (cl_api_clEnqueueCopyBuffer)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_50;
        uVar132 = extraout_XMM0_Db_50;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueCopyBuffer = p_Var55;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueReadImage","");
    p_Var56 = (cl_api_clEnqueueReadImage)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var56 == (cl_api_clEnqueueReadImage)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_51;
        uVar132 = extraout_XMM0_Db_51;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueReadImage = p_Var56;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueWriteImage","");
    p_Var57 = (cl_api_clEnqueueWriteImage)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var57 == (cl_api_clEnqueueWriteImage)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_52;
        uVar132 = extraout_XMM0_Db_52;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueWriteImage = p_Var57;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueCopyImage","");
    p_Var58 = (cl_api_clEnqueueCopyImage)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var58 == (cl_api_clEnqueueCopyImage)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_53;
        uVar132 = extraout_XMM0_Db_53;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueCopyImage = p_Var58;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clEnqueueCopyImageToBuffer","");
    p_Var59 = (cl_api_clEnqueueCopyImageToBuffer)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var59 == (cl_api_clEnqueueCopyImageToBuffer)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_54;
        uVar132 = extraout_XMM0_Db_54;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueCopyImageToBuffer = p_Var59;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clEnqueueCopyBufferToImage","");
    p_Var60 = (cl_api_clEnqueueCopyBufferToImage)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var60 == (cl_api_clEnqueueCopyBufferToImage)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_55;
        uVar132 = extraout_XMM0_Db_55;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueCopyBufferToImage = p_Var60;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueMapBuffer","");
    p_Var61 = (cl_api_clEnqueueMapBuffer)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var61 == (cl_api_clEnqueueMapBuffer)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_56;
        uVar132 = extraout_XMM0_Db_56;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueMapBuffer = p_Var61;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueMapImage","");
    p_Var62 = (cl_api_clEnqueueMapImage)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var62 == (cl_api_clEnqueueMapImage)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_57;
        uVar132 = extraout_XMM0_Db_57;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueMapImage = p_Var62;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clEnqueueUnmapMemObject","");
    p_Var63 = (cl_api_clEnqueueUnmapMemObject)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var63 == (cl_api_clEnqueueUnmapMemObject)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_58;
        uVar132 = extraout_XMM0_Db_58;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueUnmapMemObject = p_Var63;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueNDRangeKernel","")
    ;
    p_Var64 = (cl_api_clEnqueueNDRangeKernel)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var64 == (cl_api_clEnqueueNDRangeKernel)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_59;
        uVar132 = extraout_XMM0_Db_59;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueNDRangeKernel = p_Var64;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueTask","");
    p_Var65 = (cl_api_clEnqueueTask)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var65 == (cl_api_clEnqueueTask)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_60;
        uVar132 = extraout_XMM0_Db_60;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueTask = p_Var65;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueNativeKernel","");
    p_Var66 = (cl_api_clEnqueueNativeKernel)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var66 == (cl_api_clEnqueueNativeKernel)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_61;
        uVar132 = extraout_XMM0_Db_61;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueNativeKernel = p_Var66;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueMarker","");
    p_Var67 = (cl_api_clEnqueueMarker)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var67 == (cl_api_clEnqueueMarker)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_62;
        uVar132 = extraout_XMM0_Db_62;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueMarker = p_Var67;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueWaitForEvents","")
    ;
    p_Var68 = (cl_api_clEnqueueWaitForEvents)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var68 == (cl_api_clEnqueueWaitForEvents)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_63;
        uVar132 = extraout_XMM0_Db_63;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueWaitForEvents = p_Var68;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueBarrier","");
    p_Var69 = (cl_api_clEnqueueBarrier)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var69 == (cl_api_clEnqueueBarrier)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_64;
        uVar132 = extraout_XMM0_Db_64;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = false;
    }
    else {
      (this->m_Dispatch).clEnqueueBarrier = p_Var69;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clGetExtensionFunctionAddress","");
    p_Var70 = (cl_api_clGetExtensionFunctionAddress)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var70 == (cl_api_clGetExtensionFunctionAddress)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_65;
        uVar132 = extraout_XMM0_Db_65;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clGetExtensionFunctionAddress = p_Var70;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetGLContextInfoKHR","");
    p_Var71 = (cl_api_clGetGLContextInfoKHR)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var71 == (cl_api_clGetGLContextInfoKHR)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_66;
        uVar132 = extraout_XMM0_Db_66;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clGetGLContextInfoKHR = p_Var71;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateFromGLBuffer","");
    p_Var72 = (cl_api_clCreateFromGLBuffer)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var72 == (cl_api_clCreateFromGLBuffer)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_67;
        uVar132 = extraout_XMM0_Db_67;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateFromGLBuffer = p_Var72;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateFromGLTexture","");
    p_Var73 = (cl_api_clCreateFromGLTexture)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var73 == (cl_api_clCreateFromGLTexture)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_68;
        uVar132 = extraout_XMM0_Db_68;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateFromGLTexture = p_Var73;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clCreateFromGLTexture2D","");
    p_Var74 = (cl_api_clCreateFromGLTexture2D)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var74 == (cl_api_clCreateFromGLTexture2D)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_69;
        uVar132 = extraout_XMM0_Db_69;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateFromGLTexture2D = p_Var74;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clCreateFromGLTexture3D","");
    p_Var75 = (cl_api_clCreateFromGLTexture3D)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var75 == (cl_api_clCreateFromGLTexture3D)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_70;
        uVar132 = extraout_XMM0_Db_70;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateFromGLTexture3D = p_Var75;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clCreateFromGLRenderbuffer","");
    p_Var76 = (cl_api_clCreateFromGLRenderbuffer)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var76 == (cl_api_clCreateFromGLRenderbuffer)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_71;
        uVar132 = extraout_XMM0_Db_71;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateFromGLRenderbuffer = p_Var76;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetGLObjectInfo","");
    p_Var77 = (cl_api_clGetGLObjectInfo)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var77 == (cl_api_clGetGLObjectInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_72;
        uVar132 = extraout_XMM0_Db_72;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clGetGLObjectInfo = p_Var77;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetGLTextureInfo","");
    p_Var78 = (cl_api_clGetGLTextureInfo)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var78 == (cl_api_clGetGLTextureInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_73;
        uVar132 = extraout_XMM0_Db_73;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clGetGLTextureInfo = p_Var78;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clEnqueueAcquireGLObjects","");
    p_Var79 = (cl_api_clEnqueueAcquireGLObjects)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var79 == (cl_api_clEnqueueAcquireGLObjects)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_74;
        uVar132 = extraout_XMM0_Db_74;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueAcquireGLObjects = p_Var79;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clEnqueueReleaseGLObjects","");
    p_Var80 = (cl_api_clEnqueueReleaseGLObjects)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var80 == (cl_api_clEnqueueReleaseGLObjects)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_75;
        uVar132 = extraout_XMM0_Db_75;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueReleaseGLObjects = p_Var80;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clSetEventCallback","");
    p_Var81 = (cl_api_clSetEventCallback)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var81 == (cl_api_clSetEventCallback)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_76;
        uVar132 = extraout_XMM0_Db_76;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clSetEventCallback = p_Var81;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateSubBuffer","");
    p_Var82 = (cl_api_clCreateSubBuffer)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var82 == (cl_api_clCreateSubBuffer)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_77;
        uVar132 = extraout_XMM0_Db_77;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateSubBuffer = p_Var82;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clSetMemObjectDestructorCallback","");
    p_Var83 = (cl_api_clSetMemObjectDestructorCallback)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var83 == (cl_api_clSetMemObjectDestructorCallback)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_78;
        uVar132 = extraout_XMM0_Db_78;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clSetMemObjectDestructorCallback = p_Var83;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateUserEvent","");
    p_Var84 = (cl_api_clCreateUserEvent)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var84 == (cl_api_clCreateUserEvent)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_79;
        uVar132 = extraout_XMM0_Db_79;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateUserEvent = p_Var84;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clSetUserEventStatus","");
    p_Var85 = (cl_api_clSetUserEventStatus)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var85 == (cl_api_clSetUserEventStatus)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_80;
        uVar132 = extraout_XMM0_Db_80;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clSetUserEventStatus = p_Var85;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clEnqueueReadBufferRect","");
    p_Var86 = (cl_api_clEnqueueReadBufferRect)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var86 == (cl_api_clEnqueueReadBufferRect)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_81;
        uVar132 = extraout_XMM0_Db_81;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueReadBufferRect = p_Var86;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clEnqueueWriteBufferRect","");
    p_Var87 = (cl_api_clEnqueueWriteBufferRect)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var87 == (cl_api_clEnqueueWriteBufferRect)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_82;
        uVar132 = extraout_XMM0_Db_82;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueWriteBufferRect = p_Var87;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clEnqueueCopyBufferRect","");
    p_Var88 = (cl_api_clEnqueueCopyBufferRect)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var88 == (cl_api_clEnqueueCopyBufferRect)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_83;
        uVar132 = extraout_XMM0_Db_83;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueCopyBufferRect = p_Var88;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateSubDevices","");
    p_Var89 = (cl_api_clCreateSubDevices)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var89 == (cl_api_clCreateSubDevices)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_84;
        uVar132 = extraout_XMM0_Db_84;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateSubDevices = p_Var89;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clRetainDevice","");
    p_Var90 = (cl_api_clRetainDevice)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90)
    ;
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var90 == (cl_api_clRetainDevice)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_85;
        uVar132 = extraout_XMM0_Db_85;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clRetainDevice = p_Var90;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clReleaseDevice","");
    p_Var91 = (cl_api_clReleaseDevice)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var91 == (cl_api_clReleaseDevice)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_86;
        uVar132 = extraout_XMM0_Db_86;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clReleaseDevice = p_Var91;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateImage","");
    p_Var92 = (cl_api_clCreateImage)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var92 == (cl_api_clCreateImage)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_87;
        uVar132 = extraout_XMM0_Db_87;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateImage = p_Var92;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clCreateProgramWithBuiltInKernels","");
    p_Var93 = (cl_api_clCreateProgramWithBuiltInKernels)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var93 == (cl_api_clCreateProgramWithBuiltInKernels)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_88;
        uVar132 = extraout_XMM0_Db_88;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateProgramWithBuiltInKernels = p_Var93;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCompileProgram","");
    p_Var94 = (cl_api_clCompileProgram)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var94 == (cl_api_clCompileProgram)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_89;
        uVar132 = extraout_XMM0_Db_89;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCompileProgram = p_Var94;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clLinkProgram","");
    p_Var95 = (cl_api_clLinkProgram)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var95 == (cl_api_clLinkProgram)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_90;
        uVar132 = extraout_XMM0_Db_90;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clLinkProgram = p_Var95;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clUnloadPlatformCompiler","");
    p_Var96 = (cl_api_clUnloadPlatformCompiler)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var96 == (cl_api_clUnloadPlatformCompiler)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_91;
        uVar132 = extraout_XMM0_Db_91;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clUnloadPlatformCompiler = p_Var96;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetKernelArgInfo","");
    p_Var97 = (cl_api_clGetKernelArgInfo)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var97 == (cl_api_clGetKernelArgInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_92;
        uVar132 = extraout_XMM0_Db_92;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clGetKernelArgInfo = p_Var97;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueFillBuffer","");
    p_Var98 = (cl_api_clEnqueueFillBuffer)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var98 == (cl_api_clEnqueueFillBuffer)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_93;
        uVar132 = extraout_XMM0_Db_93;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueFillBuffer = p_Var98;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueFillImage","");
    p_Var99 = (cl_api_clEnqueueFillImage)
              dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var99 == (cl_api_clEnqueueFillImage)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_94;
        uVar132 = extraout_XMM0_Db_94;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueFillImage = p_Var99;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clEnqueueMigrateMemObjects","");
    p_Var100 = (cl_api_clEnqueueMigrateMemObjects)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var100 == (cl_api_clEnqueueMigrateMemObjects)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_95;
        uVar132 = extraout_XMM0_Db_95;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueMigrateMemObjects = p_Var100;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clEnqueueMarkerWithWaitList","");
    p_Var101 = (cl_api_clEnqueueMarkerWithWaitList)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var101 == (cl_api_clEnqueueMarkerWithWaitList)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_96;
        uVar132 = extraout_XMM0_Db_96;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueMarkerWithWaitList = p_Var101;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clEnqueueBarrierWithWaitList","");
    p_Var102 = (cl_api_clEnqueueBarrierWithWaitList)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var102 == (cl_api_clEnqueueBarrierWithWaitList)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_97;
        uVar132 = extraout_XMM0_Db_97;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueBarrierWithWaitList = p_Var102;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clGetExtensionFunctionAddressForPlatform","");
    p_Var103 = (cl_api_clGetExtensionFunctionAddressForPlatform)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var103 == (cl_api_clGetExtensionFunctionAddressForPlatform)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_98;
        uVar132 = extraout_XMM0_Db_98;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clGetExtensionFunctionAddressForPlatform = p_Var103;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clCreateCommandQueueWithProperties","");
    p_Var104 = (cl_api_clCreateCommandQueueWithProperties)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var104 == (cl_api_clCreateCommandQueueWithProperties)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_99;
        uVar132 = extraout_XMM0_Db_99;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateCommandQueueWithProperties = p_Var104;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreatePipe","");
    p_Var105 = (cl_api_clCreatePipe)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var105 == (cl_api_clCreatePipe)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00100;
        uVar132 = extraout_XMM0_Db_x00100;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreatePipe = p_Var105;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetPipeInfo","");
    p_Var106 = (cl_api_clGetPipeInfo)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90)
    ;
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var106 == (cl_api_clGetPipeInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00101;
        uVar132 = extraout_XMM0_Db_x00101;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clGetPipeInfo = p_Var106;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clSVMAlloc","");
    p_Var107 = (cl_api_clSVMAlloc)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var107 == (cl_api_clSVMAlloc)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00102;
        uVar132 = extraout_XMM0_Db_x00102;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clSVMAlloc = p_Var107;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clSVMFree","");
    p_Var108 = (cl_api_clSVMFree)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var108 == (cl_api_clSVMFree)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00103;
        uVar132 = extraout_XMM0_Db_x00103;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clSVMFree = p_Var108;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueSVMFree","");
    p_Var109 = (cl_api_clEnqueueSVMFree)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var109 == (cl_api_clEnqueueSVMFree)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00104;
        uVar132 = extraout_XMM0_Db_x00104;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueSVMFree = p_Var109;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueSVMMemcpy","");
    p_Var110 = (cl_api_clEnqueueSVMMemcpy)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var110 == (cl_api_clEnqueueSVMMemcpy)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00105;
        uVar132 = extraout_XMM0_Db_x00105;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueSVMMemcpy = p_Var110;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueSVMMemFill","");
    p_Var111 = (cl_api_clEnqueueSVMMemFill)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var111 == (cl_api_clEnqueueSVMMemFill)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00106;
        uVar132 = extraout_XMM0_Db_x00106;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueSVMMemFill = p_Var111;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueSVMMap","");
    p_Var112 = (cl_api_clEnqueueSVMMap)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var112 == (cl_api_clEnqueueSVMMap)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00107;
        uVar132 = extraout_XMM0_Db_x00107;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueSVMMap = p_Var112;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueSVMUnmap","");
    p_Var113 = (cl_api_clEnqueueSVMUnmap)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var113 == (cl_api_clEnqueueSVMUnmap)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00108;
        uVar132 = extraout_XMM0_Db_x00108;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueSVMUnmap = p_Var113;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clCreateSamplerWithProperties","");
    p_Var114 = (cl_api_clCreateSamplerWithProperties)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var114 == (cl_api_clCreateSamplerWithProperties)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00109;
        uVar132 = extraout_XMM0_Db_x00109;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateSamplerWithProperties = p_Var114;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clSetKernelArgSVMPointer","");
    p_Var115 = (cl_api_clSetKernelArgSVMPointer)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var115 == (cl_api_clSetKernelArgSVMPointer)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00110;
        uVar132 = extraout_XMM0_Db_x00110;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clSetKernelArgSVMPointer = p_Var115;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clSetKernelExecInfo","");
    p_Var116 = (cl_api_clSetKernelExecInfo)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var116 == (cl_api_clSetKernelExecInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00111;
        uVar132 = extraout_XMM0_Db_x00111;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clSetKernelExecInfo = p_Var116;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCloneKernel","");
    p_Var117 = (cl_api_clCloneKernel)dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90)
    ;
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var117 == (cl_api_clCloneKernel)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00112;
        uVar132 = extraout_XMM0_Db_x00112;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCloneKernel = p_Var117;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clCreateProgramWithIL","");
    p_Var118 = (cl_api_clCreateProgramWithIL)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var118 == (cl_api_clCreateProgramWithIL)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00113;
        uVar132 = extraout_XMM0_Db_x00113;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateProgramWithIL = p_Var118;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clEnqueueSVMMigrateMem","")
    ;
    p_Var119 = (cl_api_clEnqueueSVMMigrateMem)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var119 == (cl_api_clEnqueueSVMMigrateMem)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00114;
        uVar132 = extraout_XMM0_Db_x00114;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clEnqueueSVMMigrateMem = p_Var119;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clGetDeviceAndHostTimer","");
    p_Var120 = (cl_api_clGetDeviceAndHostTimer)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var120 == (cl_api_clGetDeviceAndHostTimer)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00115;
        uVar132 = extraout_XMM0_Db_x00115;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clGetDeviceAndHostTimer = p_Var120;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clGetHostTimer","");
    p_Var121 = (cl_api_clGetHostTimer)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var121 == (cl_api_clGetHostTimer)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00116;
        uVar132 = extraout_XMM0_Db_x00116;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clGetHostTimer = p_Var121;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clGetKernelSubGroupInfo","");
    p_Var122 = (cl_api_clGetKernelSubGroupInfo)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var122 == (cl_api_clGetKernelSubGroupInfo)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00117;
        uVar132 = extraout_XMM0_Db_x00117;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clGetKernelSubGroupInfo = p_Var122;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clSetDefaultDeviceCommandQueue","");
    p_Var123 = (cl_api_clSetDefaultDeviceCommandQueue)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var123 == (cl_api_clSetDefaultDeviceCommandQueue)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00118;
        uVar132 = extraout_XMM0_Db_x00118;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clSetDefaultDeviceCommandQueue = p_Var123;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clSetProgramReleaseCallback","");
    p_Var124 = (cl_api_clSetProgramReleaseCallback)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var124 == (cl_api_clSetProgramReleaseCallback)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00119;
        uVar132 = extraout_XMM0_Db_x00119;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clSetProgramReleaseCallback = p_Var124;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clSetProgramSpecializationConstant","");
    p_Var125 = (cl_api_clSetProgramSpecializationConstant)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var125 == (cl_api_clSetProgramSpecializationConstant)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00120;
        uVar132 = extraout_XMM0_Db_x00120;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clSetProgramSpecializationConstant = p_Var125;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clCreateBufferWithProperties","");
    p_Var126 = (cl_api_clCreateBufferWithProperties)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var126 == (cl_api_clCreateBufferWithProperties)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00121;
        uVar132 = extraout_XMM0_Db_x00121;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateBufferWithProperties = p_Var126;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clCreateImageWithProperties","");
    p_Var127 = (cl_api_clCreateImageWithProperties)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var127 == (cl_api_clCreateImageWithProperties)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00122;
        uVar132 = extraout_XMM0_Db_x00122;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clCreateImageWithProperties = p_Var127;
    }
    pvVar3 = *ppvVar1;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"clSetContextDestructorCallback","");
    p_Var128 = (cl_api_clSetContextDestructorCallback)
               dlsym(-(ulong)(pvVar3 == (void *)0x0) | (ulong)pvVar3,local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (p_Var128 == (cl_api_clSetContextDestructorCallback)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Couldn\'t get exported function pointer to: ","");
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)local_50);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = puVar129[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*puVar129;
      }
      local_68 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      puVar129 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = puVar129 + 2;
      if ((long *)*puVar129 == plVar4) {
        uVar131 = (undefined4)*plVar4;
        uVar132 = *(undefined4 *)((long)puVar129 + 0x14);
        local_80 = *plVar4;
        uStack_78 = *(undefined4 *)(puVar129 + 3);
        uStack_74 = *(undefined4 *)((long)puVar129 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        uVar131 = extraout_XMM0_Da_x00123;
        uVar132 = extraout_XMM0_Db_x00123;
        local_90 = (long *)*puVar129;
      }
      local_88 = puVar129[1];
      *puVar129 = plVar4;
      puVar129[1] = 0;
      *(undefined1 *)(puVar129 + 2) = 0;
      log(this,(double)CONCAT44(uVar132,uVar131));
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      (this->m_Dispatch).clSetContextDestructorCallback = p_Var128;
    }
  }
  if ((bVar2 == false) && (*ppvVar1 != (void *)0x0)) {
    dlclose();
    *ppvVar1 = (void *)0x0;
  }
  return bVar2;
}

Assistant:

bool CLIntercept::initDispatch( const std::string& libName )
{
    bool success = true;

    if( success )
    {
        m_OpenCLLibraryHandle = OS().LoadLibrary( libName.c_str() );
        if( m_OpenCLLibraryHandle == NULL )
        {
            log( std::string("Couldn't load library: ") + libName + "\n");
            success = false;
        }
    }

    if( success )
    {
        INIT_EXPORTED_FUNC(clGetPlatformIDs);
        INIT_EXPORTED_FUNC(clGetPlatformInfo);
        INIT_EXPORTED_FUNC(clGetDeviceIDs);
        INIT_EXPORTED_FUNC(clGetDeviceInfo);
        INIT_EXPORTED_FUNC(clCreateContext);
        INIT_EXPORTED_FUNC(clCreateContextFromType);
        INIT_EXPORTED_FUNC(clRetainContext);
        INIT_EXPORTED_FUNC(clReleaseContext);
        INIT_EXPORTED_FUNC(clGetContextInfo);
        INIT_EXPORTED_FUNC(clCreateCommandQueue);
        INIT_EXPORTED_FUNC(clRetainCommandQueue);
        INIT_EXPORTED_FUNC(clReleaseCommandQueue);
        INIT_EXPORTED_FUNC(clGetCommandQueueInfo);
        INIT_EXPORTED_FUNC(clSetCommandQueueProperty);
        INIT_EXPORTED_FUNC(clCreateBuffer);
        INIT_EXPORTED_FUNC(clCreateImage2D);
        INIT_EXPORTED_FUNC(clCreateImage3D);
        INIT_EXPORTED_FUNC(clRetainMemObject);
        INIT_EXPORTED_FUNC(clReleaseMemObject);
        INIT_EXPORTED_FUNC(clGetSupportedImageFormats);
        INIT_EXPORTED_FUNC(clGetMemObjectInfo);
        INIT_EXPORTED_FUNC(clGetImageInfo);
        INIT_EXPORTED_FUNC(clCreateSampler);
        INIT_EXPORTED_FUNC(clRetainSampler);
        INIT_EXPORTED_FUNC(clReleaseSampler);
        INIT_EXPORTED_FUNC(clGetSamplerInfo);
        INIT_EXPORTED_FUNC(clCreateProgramWithSource);
        INIT_EXPORTED_FUNC(clCreateProgramWithBinary);
        INIT_EXPORTED_FUNC(clRetainProgram);
        INIT_EXPORTED_FUNC(clReleaseProgram);
        INIT_EXPORTED_FUNC(clBuildProgram);
        INIT_EXPORTED_FUNC(clUnloadCompiler);
        INIT_EXPORTED_FUNC(clGetProgramInfo);
        INIT_EXPORTED_FUNC(clGetProgramBuildInfo);
        INIT_EXPORTED_FUNC(clCreateKernel);
        INIT_EXPORTED_FUNC(clCreateKernelsInProgram);
        INIT_EXPORTED_FUNC(clRetainKernel);
        INIT_EXPORTED_FUNC(clReleaseKernel);
        INIT_EXPORTED_FUNC(clSetKernelArg);
        INIT_EXPORTED_FUNC(clGetKernelInfo);
        INIT_EXPORTED_FUNC(clGetKernelWorkGroupInfo);
        INIT_EXPORTED_FUNC(clWaitForEvents);
        INIT_EXPORTED_FUNC(clGetEventInfo);
        INIT_EXPORTED_FUNC(clRetainEvent);
        INIT_EXPORTED_FUNC(clReleaseEvent);
        INIT_EXPORTED_FUNC(clGetEventProfilingInfo);
        INIT_EXPORTED_FUNC(clFlush);
        INIT_EXPORTED_FUNC(clFinish);
        INIT_EXPORTED_FUNC(clEnqueueReadBuffer);
        INIT_EXPORTED_FUNC(clEnqueueWriteBuffer);
        INIT_EXPORTED_FUNC(clEnqueueCopyBuffer);
        INIT_EXPORTED_FUNC(clEnqueueReadImage);
        INIT_EXPORTED_FUNC(clEnqueueWriteImage);
        INIT_EXPORTED_FUNC(clEnqueueCopyImage);
        INIT_EXPORTED_FUNC(clEnqueueCopyImageToBuffer);
        INIT_EXPORTED_FUNC(clEnqueueCopyBufferToImage);
        INIT_EXPORTED_FUNC(clEnqueueMapBuffer);
        INIT_EXPORTED_FUNC(clEnqueueMapImage);
        INIT_EXPORTED_FUNC(clEnqueueUnmapMemObject);
        INIT_EXPORTED_FUNC(clEnqueueNDRangeKernel);
        INIT_EXPORTED_FUNC(clEnqueueTask);
        INIT_EXPORTED_FUNC(clEnqueueNativeKernel);
        INIT_EXPORTED_FUNC(clEnqueueMarker);
        INIT_EXPORTED_FUNC(clEnqueueWaitForEvents);
        INIT_EXPORTED_FUNC(clEnqueueBarrier);

        bool    savedSuccess = success;

        INIT_EXPORTED_FUNC(clGetExtensionFunctionAddress);

        // cl_khr_gl_sharing (optional)
        // The entry points for this extension are exported from the ICD
        // loader even though they are extension APIs.
        INIT_EXPORTED_FUNC( clGetGLContextInfoKHR );
#if defined(_WIN32) || defined(__linux__) || defined(__FreeBSD__)
        INIT_EXPORTED_FUNC( clCreateFromGLBuffer );
        INIT_EXPORTED_FUNC( clCreateFromGLTexture );
        INIT_EXPORTED_FUNC( clCreateFromGLTexture2D );
        INIT_EXPORTED_FUNC( clCreateFromGLTexture3D );
        INIT_EXPORTED_FUNC( clCreateFromGLRenderbuffer );
        INIT_EXPORTED_FUNC( clGetGLObjectInfo );
        INIT_EXPORTED_FUNC( clGetGLTextureInfo );   // OpenCL 1.2
        INIT_EXPORTED_FUNC( clEnqueueAcquireGLObjects );
        INIT_EXPORTED_FUNC( clEnqueueReleaseGLObjects );
#endif

        // OpenCL 1.1 Entry Points (optional)
        INIT_EXPORTED_FUNC(clSetEventCallback);
        INIT_EXPORTED_FUNC(clCreateSubBuffer);
        INIT_EXPORTED_FUNC(clSetMemObjectDestructorCallback);
        INIT_EXPORTED_FUNC(clCreateUserEvent);
        INIT_EXPORTED_FUNC(clSetUserEventStatus);
        INIT_EXPORTED_FUNC(clEnqueueReadBufferRect);
        INIT_EXPORTED_FUNC(clEnqueueWriteBufferRect);
        INIT_EXPORTED_FUNC(clEnqueueCopyBufferRect);

        // OpenCL 1.2 Entry Points (optional)
        INIT_EXPORTED_FUNC(clCreateSubDevices);
        INIT_EXPORTED_FUNC(clRetainDevice);
        INIT_EXPORTED_FUNC(clReleaseDevice);
        INIT_EXPORTED_FUNC(clCreateImage);
        INIT_EXPORTED_FUNC(clCreateProgramWithBuiltInKernels);
        INIT_EXPORTED_FUNC(clCompileProgram);
        INIT_EXPORTED_FUNC(clLinkProgram);
        INIT_EXPORTED_FUNC(clUnloadPlatformCompiler);
        INIT_EXPORTED_FUNC(clGetKernelArgInfo);
        INIT_EXPORTED_FUNC(clEnqueueFillBuffer);
        INIT_EXPORTED_FUNC(clEnqueueFillImage);
        INIT_EXPORTED_FUNC(clEnqueueMigrateMemObjects);
        INIT_EXPORTED_FUNC(clEnqueueMarkerWithWaitList);
        INIT_EXPORTED_FUNC(clEnqueueBarrierWithWaitList);
        INIT_EXPORTED_FUNC(clGetExtensionFunctionAddressForPlatform);

        // OpenCL 2.0 Entry Points (optional)
        INIT_EXPORTED_FUNC(clCreateCommandQueueWithProperties);
        INIT_EXPORTED_FUNC(clCreatePipe);
        INIT_EXPORTED_FUNC(clGetPipeInfo);
        INIT_EXPORTED_FUNC(clSVMAlloc);
        INIT_EXPORTED_FUNC(clSVMFree);
        INIT_EXPORTED_FUNC(clEnqueueSVMFree);
        INIT_EXPORTED_FUNC(clEnqueueSVMMemcpy);
        INIT_EXPORTED_FUNC(clEnqueueSVMMemFill);
        INIT_EXPORTED_FUNC(clEnqueueSVMMap);
        INIT_EXPORTED_FUNC(clEnqueueSVMUnmap);
        INIT_EXPORTED_FUNC(clCreateSamplerWithProperties);
        INIT_EXPORTED_FUNC(clSetKernelArgSVMPointer);
        INIT_EXPORTED_FUNC(clSetKernelExecInfo);

        // OpenCL 2.1 Entry Points (optional)
        INIT_EXPORTED_FUNC(clCloneKernel);
        INIT_EXPORTED_FUNC(clCreateProgramWithIL);
        INIT_EXPORTED_FUNC(clEnqueueSVMMigrateMem);
        INIT_EXPORTED_FUNC(clGetDeviceAndHostTimer);
        INIT_EXPORTED_FUNC(clGetHostTimer);
        INIT_EXPORTED_FUNC(clGetKernelSubGroupInfo);
        INIT_EXPORTED_FUNC(clSetDefaultDeviceCommandQueue);

        // OpenCL 2.2 Entry Points (optional)
        INIT_EXPORTED_FUNC(clSetProgramReleaseCallback);
        INIT_EXPORTED_FUNC(clSetProgramSpecializationConstant);

        // OpenCL 3.0 Entry Points (optional)
        INIT_EXPORTED_FUNC(clCreateBufferWithProperties);
        INIT_EXPORTED_FUNC(clCreateImageWithProperties);
        INIT_EXPORTED_FUNC(clSetContextDestructorCallback);

        success = savedSuccess;
    }

    if( !success )
    {
        if( m_OpenCLLibraryHandle != NULL )
        {
            OS().UnloadLibrary( m_OpenCLLibraryHandle );
            m_OpenCLLibraryHandle = NULL;
        }
    }

    return success;
}